

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotation_matrices.cpp
# Opt level: O0

void rotationMatrices(void)

{
  ostream *poVar1;
  void *pvVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Scalar *pSVar3;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar4;
  Scalar *pSVar5;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> *this_00;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *m;
  Scalar *pSVar6;
  TranslationPart local_4a8;
  TranslationPart local_478;
  TranslationPart local_448;
  TranslationPart local_418;
  QuaternionType local_3e8;
  QuaternionType local_3c8;
  Scalar local_3a0;
  Scalar local_398;
  Scalar local_390;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> local_388 [48];
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> local_358;
  undefined1 local_338 [8];
  Affine3d transform_2;
  Scalar local_2b0;
  Scalar local_2ac;
  Scalar local_2a8;
  Scalar local_2a4;
  float local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  float local_278;
  float local_274;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> local_270;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_240;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_220 [8];
  Vector3d translation;
  Matrix4f M;
  Affine3f t1;
  double tzLeft;
  double tyLeft;
  double txLeft;
  undefined1 local_128 [8];
  Matrix3d rotation;
  undefined1 local_c0 [8];
  AngleAxisd yawAngle;
  undefined1 local_80 [8];
  AngleAxisd pitchAngle;
  undefined1 local_40 [8];
  AngleAxisd rollAngle;
  double yaw;
  double pitch;
  double roll;
  
  pitch = 1.5707963267948966;
  yaw = 1.5707963267948966;
  rollAngle.m_angle = 0.5235987755982988;
  poVar1 = std::operator<<((ostream *)&std::cout,"Roll : ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,pitch);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Pitch : ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,yaw);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Yaw : ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,rollAngle.m_angle);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)local_40,&pitch,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&pitchAngle.m_angle);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)local_80,&yaw,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&yawAngle.m_angle);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)local_c0,&rollAngle.m_angle,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)(rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_128);
  eulerAnglesToRotationMatrix((Matrix3d *)&txLeft,pitch,yaw,rollAngle.m_angle);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_128,(Matrix3d *)&txLeft);
  tyLeft = -1.0;
  tzLeft = 0.0;
  t1.m_matrix.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  t1.m_matrix.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = -2.25;
  Eigen::Transform<float,_3,_2,_0>::Transform
            ((Transform<float,_3,_2,_0> *)
             (M.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
             0xe));
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_220);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<(&local_240,local_220,&tyLeft);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   (&local_240,&tzLeft);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (this,(Scalar *)
                  (t1.m_matrix.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                   .m_data.array + 0xe));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_240);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,0,0);
  local_274 = (float)*pSVar3;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator<<
            (&local_270,
             (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2),&local_274);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,0,1);
  local_278 = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (&local_270,&local_278);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,0,2);
  local_27c = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_27c);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_220,0,0);
  local_280 = (float)*pSVar5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_280);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,1,0);
  local_284 = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_284);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,1,1);
  local_288 = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_288);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,1,2);
  local_28c = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_28c);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_220,1,0);
  local_290 = (float)*pSVar5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_290);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,2,0);
  local_294 = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_294);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,2,1);
  local_298 = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_298);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_128,2,2);
  local_29c = (float)*pSVar3;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_29c);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_220,2,0);
  local_2a0 = (float)*pSVar5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_2a0);
  local_2a4 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_2a4);
  local_2a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_2a8);
  local_2ac = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_2ac);
  local_2b0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar4,&local_2b0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_270);
  Eigen::Transform<float,3,2,0>::operator=
            ((Transform<float,3,2,0> *)
             (M.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
             0xe),(EigenBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                  (translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array + 2));
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::Transform<double,_3,_2,_0>::translation
            ((TranslationPart *)local_388,(Transform<double,_3,_2,_0> *)local_338);
  local_390 = 2.5;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>::operator<<
            (&local_358,local_388,&local_390);
  local_398 = 1.0;
  this_00 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>
            ::operator_(&local_358,&local_398);
  local_3a0 = 0.5;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>::
  operator_(this_00,&local_3a0);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>::
  ~CommaInitializer(&local_358);
  Eigen::AngleAxis<double>::operator*
            (&local_3e8,(AngleAxis<double> *)local_c0,(AngleAxis<double> *)local_80);
  Eigen::operator*(&local_3c8,&local_3e8,(AngleAxis<double> *)local_40);
  Eigen::Transform<double,3,2,0>::rotate<Eigen::Quaternion<double,0>>
            ((Transform<double,3,2,0> *)local_338,&local_3c8);
  m = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
      Eigen::Transform<double,_3,_2,_0>::matrix((Transform<double,_3,_2,_0> *)local_338);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,m);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Transform<double,_3,_2,_0>::translation(&local_418,(Transform<double,_3,_2,_0> *)local_338)
  ;
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>
                              *)&local_418);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Transform<double,_3,_2,_0>::translation(&local_448,(Transform<double,_3,_2,_0> *)local_338)
  ;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>
           ::x((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1> *
               )&local_448);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,*pSVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Transform<double,_3,_2,_0>::translation(&local_478,(Transform<double,_3,_2,_0> *)local_338)
  ;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>
           ::y((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1> *
               )&local_478);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,*pSVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Transform<double,_3,_2,_0>::translation(&local_4a8,(Transform<double,_3,_2,_0> *)local_338)
  ;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>
           ::z((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1> *
               )&local_4a8);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,*pSVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void rotationMatrices() {

  //////////////////// Rotation Matrix (Tait–Bryan) ////////////////////////
  double roll, pitch, yaw;
  roll = M_PI / 2;
  pitch = M_PI / 2;
  yaw = M_PI / 6;
  std::cout << "Roll : " << roll << std::endl;
  std::cout << "Pitch : " << pitch << std::endl;
  std::cout << "Yaw : " << yaw << std::endl;

  // Roll, Pitch, Yaw to Rotation Matrix
  // Eigen::AngleAxis<double> rollAngle(roll, Eigen::Vector3d(1,0,0));
  Eigen::AngleAxisd rollAngle(roll, Eigen::Vector3d::UnitX());
  Eigen::AngleAxisd pitchAngle(pitch, Eigen::Vector3d::UnitY());
  Eigen::AngleAxisd yawAngle(yaw, Eigen::Vector3d::UnitZ());

////////////////////////////////////////Comparing with
/// KDL////////////////////////////////////////
#if KDL_FOUND == 1
  KDL::Frame F;
  F.M = F.M.RPY(roll, pitch, yaw);
  std::cout << F.M(0, 0) << " " << F.M(0, 1) << " " << F.M(0, 2) << std::endl;
  std::cout << F.M(1, 0) << " " << F.M(1, 1) << " " << F.M(1, 2) << std::endl;
  std::cout << F.M(2, 0) << " " << F.M(2, 1) << " " << F.M(2, 2) << std::endl;

  double x, y, z, w;
  F.M.GetQuaternion(x, y, z, w);
  std::cout << "KDL Frame Quaternion:" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "w: " << w << std::endl;
#endif

  Eigen::Matrix3d rotation;
  rotation = eulerAnglesToRotationMatrix(roll, pitch, yaw);

  double txLeft, tyLeft, tzLeft;
  txLeft = -1;
  tyLeft = 0.0;
  tzLeft = -4.0;

  Eigen::Affine3f t1;
  Eigen::Matrix4f M;
  Eigen::Vector3d translation;
  translation << txLeft, tyLeft, tzLeft;

  M << rotation(0, 0), rotation(0, 1), rotation(0, 2), translation(0, 0),
      rotation(1, 0), rotation(1, 1), rotation(1, 2), translation(1, 0),
      rotation(2, 0), rotation(2, 1), rotation(2, 2), translation(2, 0), 0, 0,
      0, 1;

  t1 = M;

  Eigen::Affine3d transform_2 = Eigen::Affine3d::Identity();

  // Define a translation of 2.5 meters on the x axis.
  transform_2.translation() << 2.5, 1.0, 0.5;

  // The same rotation matrix as before; tetha radians arround Z axis
  transform_2.rotate(yawAngle * pitchAngle * rollAngle);
  std::cout << transform_2.matrix() << std::endl;
  std::cout << transform_2.translation() << std::endl;
  std::cout << transform_2.translation().x() << std::endl;
  std::cout << transform_2.translation().y() << std::endl;
  std::cout << transform_2.translation().z() << std::endl;
}